

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

char * __thiscall ON_String::ReserveArray(ON_String *this,size_t array_capacity)

{
  void *pvVar1;
  char *pcVar2;
  uint uVar3;
  uint capacity;
  ON_Internal_Empty_aString *pOVar4;
  ON_Internal_Empty_aString *hdr;
  
  if (array_capacity != 0) {
    hdr = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      hdr = &empty_astring;
    }
    if (array_capacity < 0xffffffff) {
      capacity = (uint)array_capacity;
      if (hdr == &empty_astring) {
        CreateArray(this,capacity);
      }
      else if ((hdr->header).ref_count.super___atomic_base<int>._M_i < 2) {
        if ((hdr->header).string_capacity < (int)capacity) {
          pvVar1 = onrealloc(hdr,(long)(int)capacity + 0xd);
          this->m_s = (char *)((long)pvVar1 + 0xc);
          memset((void *)((long)pvVar1 + (long)*(int *)((long)pvVar1 + 8) + 0xc),0,
                 (long)(int)((capacity - *(int *)((long)pvVar1 + 8)) + 1));
          *(uint *)((long)pvVar1 + 8) = capacity;
        }
      }
      else {
        this->m_s = (char *)0x849344;
        CreateArray(this,capacity);
        uVar3 = (hdr->header).string_length;
        if ((int)capacity <= (int)uVar3) {
          uVar3 = capacity;
        }
        if (0 < (int)uVar3) {
          pOVar4 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
          if (this->m_s == (char *)0x0) {
            pOVar4 = &empty_astring;
          }
          memcpy(&pOVar4->s,&hdr->s,(ulong)uVar3);
          (pOVar4->header).string_length = uVar3;
        }
        ON_aStringHeader_DecrementRefCountAndDeleteIfZero(&hdr->header);
      }
      pcVar2 = Array(this);
      return pcVar2;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string.cpp"
               ,0x130,"","Requested capacity > ON_String::MaximumStringLength");
  }
  return (char *)0x0;
}

Assistant:

char* ON_String::ReserveArray( size_t array_capacity )
{
  if (array_capacity <= 0)
    return nullptr;

  ON_aStringHeader* hdr0 = Header();

  if (array_capacity > (size_t)ON_String::MaximumStringLength)
  {
    ON_ERROR("Requested capacity > ON_String::MaximumStringLength");
    return nullptr;
  }

  const int capacity = (int)array_capacity; // for 64 bit compiler
  if ( hdr0 == pEmptyStringHeader || nullptr == hdr0 ) 
  {
		CreateArray(capacity);
  }
  else if ( (int)(hdr0->ref_count) > 1 ) 
  {
    // Calling Create() here insures hdr0 remains valid until we decrement below.
    Create();

    // Allocate a new array
		CreateArray(capacity);
    ON_aStringHeader* hdr1 = Header();
    const int size = (capacity < hdr0->string_length) ? capacity : hdr0->string_length;
    if ( size > 0 ) 
    {
      memcpy( hdr1->string_array(), hdr0->string_array(), size*sizeof(*m_s) );
      hdr1->string_length = size;
    }
    // "this" no longer requires access to the original header
    // If we are in a multi-threaded situation and another thread
    // has decremented ref_count since the > 1 check above,
    // we might end up deleting hdr0.
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
	else if ( capacity > hdr0->string_capacity ) 
  {
		hdr0 = (ON_aStringHeader*)onrealloc( hdr0, sizeof(ON_aStringHeader) + (capacity+1)*sizeof(*m_s) );
    m_s = hdr0->string_array();
    memset( &m_s[hdr0->string_capacity], 0, (1 + capacity - hdr0->string_capacity)*sizeof(*m_s) );
    hdr0->string_capacity = capacity;
	}
  return Array();
}